

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

void __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
insertnonleaf(BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this
             ,unsigned_long_long *key,int *cur,node **p,int *pp,locType *pos,locType wz)

{
  int iVar1;
  long lVar2;
  int *in_RCX;
  unsigned_long_long *in_RDX;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *in_RSI;
  int *in_RDI;
  node **in_R8;
  int *in_R9;
  undefined1 auVar3 [16];
  locType unaff_retaddr;
  undefined8 in_stack_00000008;
  node *y;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk_1;
  unsigned_long_long tmpk [100];
  locType tmpp [101];
  int j;
  int i;
  node **x;
  node *x_1;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  undefined8 local_6b0;
  undefined8 local_6a8 [100];
  undefined8 local_388 [100];
  undefined8 local_68;
  int local_58;
  int local_54;
  long *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  locType *in_stack_ffffffffffffffc8;
  
  if ((int)*in_RDX == -1) {
    auVar3 = (**(code **)(**(long **)(in_RDI + 4) + 8))();
    local_48 = auVar3._0_8_;
    *(long *)(in_RDI + 2) = auVar3._8_8_;
    *in_RDI = *in_RDI + 1;
    *(undefined4 *)(local_48 + 200) = 1;
    local_48[0x65] = *(undefined8 *)in_RSI;
    *local_48 = *(undefined8 *)in_R9;
    local_48[1] = in_stack_00000008;
    local_40 = local_48;
    (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),in_RDI + 2);
  }
  else {
    local_50 = (long *)(in_RCX + (long)(int)*in_RDX * 2);
    local_58 = *(int *)((long)in_R8 + (long)(int)*in_RDX * 4);
    if (*(int *)(*local_50 + 0x640) < 99) {
      for (local_54 = *(int *)(*local_50 + 0x640); local_58 < local_54; local_54 = local_54 + -1) {
        *(undefined8 *)(*local_50 + 0x328 + (long)local_54 * 8) =
             *(undefined8 *)(*local_50 + 0x328 + (long)(local_54 + -1) * 8);
        *(undefined8 *)(*local_50 + (long)(local_54 + 1) * 8) =
             *(undefined8 *)(*local_50 + (long)local_54 * 8);
      }
      *(undefined8 *)(*local_50 + 0x328 + (long)local_58 * 8) = *(undefined8 *)in_RSI;
      *(undefined8 *)(*local_50 + (long)(local_58 + 1) * 8) = in_stack_00000008;
      *(int *)(*local_50 + 0x640) = *(int *)(*local_50 + 0x640) + 1;
      (**(code **)(**(long **)(in_RDI + 4) + 0x18))
                (*(long **)(in_RDI + 4),in_R9 + (long)(int)*in_RDX * 2);
    }
    else {
      local_388[0] = *(undefined8 *)*local_50;
      for (local_54 = 0; local_54 < local_58; local_54 = local_54 + 1) {
        local_388[local_54 + 1] = *(undefined8 *)(*local_50 + (long)(local_54 + 1) * 8);
        local_6a8[local_54] = *(undefined8 *)(*local_50 + 0x328 + (long)local_54 * 8);
      }
      local_388[local_58 + 1] = in_stack_00000008;
      local_6a8[local_58] = *(undefined8 *)in_RSI;
      iVar1 = local_58;
      while (local_54 = iVar1 + 1, local_54 < 100) {
        local_388[iVar1 + 2] = *(undefined8 *)(*local_50 + (long)local_54 * 8);
        local_6a8[local_54] = *(undefined8 *)(*local_50 + 0x328 + (long)(local_54 + -1) * 8);
        iVar1 = local_54;
      }
      *(undefined4 *)(*local_50 + 0x640) = 0x32;
      for (local_54 = 0; local_54 < *(int *)(*local_50 + 0x640); local_54 = local_54 + 1) {
        *(undefined8 *)(*local_50 + (long)local_54 * 8) = local_388[local_54];
        *(undefined8 *)(*local_50 + 0x328 + (long)local_54 * 8) = local_6a8[local_54];
      }
      *(undefined8 *)(*local_50 + (long)*(int *)(*local_50 + 0x640) * 8) = local_388[local_54];
      auVar3 = (**(code **)(**(long **)(in_RDI + 4) + 8))();
      local_6b0 = auVar3._8_8_;
      lVar2 = auVar3._0_8_;
      for (local_54 = *(int *)(*local_50 + 0x640) + 1; local_54 < 100; local_54 = local_54 + 1) {
        *(undefined8 *)(lVar2 + (long)((local_54 - *(int *)(*local_50 + 0x640)) + -1) * 8) =
             local_388[local_54];
        *(undefined8 *)(lVar2 + 0x328 + (long)((local_54 - *(int *)(*local_50 + 0x640)) + -1) * 8) =
             local_6a8[local_54];
      }
      *(int *)(lVar2 + 0x640) = 99 - *(int *)(*local_50 + 0x640);
      *(undefined8 *)(lVar2 + (long)*(int *)(lVar2 + 0x640) * 8) = local_68;
      (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),&local_6b0);
      (**(code **)(**(long **)(in_RDI + 4) + 0x18))
                (*(long **)(in_RDI + 4),in_R9 + (long)(int)*in_RDX * 2);
      insertnonleaf(in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void insertnonleaf(const Key &key, const int &cur, node **p, int *pp, locType *pos, locType wz) {
            if (cur == -1) {
                auto lnk = file->newspace();
                root = lnk.second;
                node *x = lnk.first;
                ++depth;
                x->sz = 1;
                x->keyvalue[0] = key;
                x->pointer[0] = pos[0];
                x->pointer[1] = wz;
                file->save(root);
                return;
            }
            node *&x = p[cur];
            int i, j = pp[cur];
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->pointer[i + 1] = x->pointer[i];
                x->keyvalue[j] = key;
                x->pointer[j + 1] = wz;
                ++x->sz;
                file->save(pos[cur]);
            } else {
                locType tmpp[degree + 1];
                Key tmpk[degree];
                tmpp[0] = x->pointer[0];
                for (i = 0; i < j; ++i)tmpp[i + 1] = x->pointer[i + 1], tmpk[i] = x->keyvalue[i];
                tmpp[j + 1] = wz;
                tmpk[j] = key;
                for (i = j + 1; i < degree; ++i)tmpp[i + 1] = x->pointer[i], tmpk[i] = x->keyvalue[i - 1];
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[i];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = x->sz + 1; i < degree; ++i)
                    y->pointer[i - x->sz - 1] = tmpp[i], y->keyvalue[i - x->sz - 1] = tmpk[i];
                y->sz = degree - 1 - x->sz;
                y->pointer[y->sz] = tmpp[degree];
                file->save(lnk.second);
                file->save(pos[cur]);
                insertnonleaf(tmpk[x->sz], cur - 1, p, pp, pos, lnk.second);
            }
        }